

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinSelectWithFilterExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
          (BumpAllocator *this,BinsSelectExpr *args,Expression *args_1,Expression **args_2)

{
  Expression *matchesExpr;
  Expression *in_RCX;
  BinsSelectExpr *in_RDX;
  BinSelectWithFilterExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  matchesExpr = (Expression *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::BinSelectWithFilterExpr::BinSelectWithFilterExpr(in_RSI,in_RDX,in_RCX,matchesExpr);
  return (BinSelectWithFilterExpr *)matchesExpr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }